

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_UInt32 * FT_Face_GetVariantSelectors(FT_Face face)

{
  code *UNRECOVERED_JUMPTABLE;
  FT_CMap_conflict vcmap;
  FT_CharMap pFVar1;
  FT_UInt32 *pFVar2;
  undefined8 extraout_RDX;
  
  if (face != (FT_Face)0x0) {
    pFVar1 = find_variant_selector_charmap(face);
    if (pFVar1 != (FT_CharMap)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)&(pFVar1[1].face)->num_fixed_sizes;
      pFVar2 = (FT_UInt32 *)
               (*UNRECOVERED_JUMPTABLE)(pFVar1,face->memory,extraout_RDX,UNRECOVERED_JUMPTABLE);
      return pFVar2;
    }
  }
  return (FT_UInt32 *)0x0;
}

Assistant:

FT_EXPORT_DEF( FT_UInt32* )
  FT_Face_GetVariantSelectors( FT_Face  face )
  {
    FT_UInt32  *result = NULL;


    if ( face )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );


      if ( charmap )
      {
        FT_CMap    vcmap  = FT_CMAP( charmap );
        FT_Memory  memory = FT_FACE_MEMORY( face );


        result = vcmap->clazz->variant_list( vcmap, memory );
      }
    }

    return result;
  }